

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
duckdb::InvalidInputException::InvalidInputException<long,long>
          (InvalidInputException *this,string *msg,long params,long params_1)

{
  long in_RCX;
  string *in_RDX;
  InvalidInputException *in_RDI;
  string local_40 [24];
  long in_stack_ffffffffffffffd8;
  
  Exception::ConstructMessage<long,long>(in_RDX,in_RCX,in_stack_ffffffffffffffd8);
  duckdb::InvalidInputException::InvalidInputException(in_RDI,local_40);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

explicit InvalidInputException(const string &msg, ARGS... params)
	    : InvalidInputException(ConstructMessage(msg, params...)) {
	}